

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

void Acb_NtkResetNode(Acb_Ntk_t *p,int Pivot,word uTruth,Vec_Int_t *vSupp)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Vec_Int_t *p_01;
  Vec_Int_t *vFanins;
  int *pFanins;
  int iFanin;
  int k;
  Vec_Int_t *vSupp_local;
  word uTruth_local;
  int Pivot_local;
  Acb_Ntk_t *p_local;
  
  p_00 = Vec_IntAlloc(6);
  iVar1 = Acb_ObjIsCio(p,Pivot);
  if (iVar1 != 0) {
    __assert_fail("!Acb_ObjIsCio(p, Pivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                  ,0x28a,"void Acb_NtkResetNode(Acb_Ntk_t *, int, word, Vec_Int_t *)");
  }
  pFanins._4_4_ = 0;
  piVar3 = Acb_ObjFanins(p,Pivot);
  for (; pFanins._4_4_ < *piVar3; pFanins._4_4_ = pFanins._4_4_ + 1) {
    Vec_IntPush(p_00,piVar3[pFanins._4_4_ + 1]);
  }
  Vec_WrdSetEntry(&p->vObjTruth,Pivot,uTruth);
  p_01 = Vec_WecEntry(&p->vCnfs,Pivot);
  Vec_IntErase(p_01);
  Acb_ObjRemoveFaninFanout(p,Pivot);
  Acb_ObjRemoveFanins(p,Pivot);
  if (vSupp == (Vec_Int_t *)0x0) {
    iVar1 = Acb_ObjFanoutNum(p,Pivot);
    if (iVar1 == 0) {
      Acb_ObjCleanType(p,Pivot);
    }
  }
  else {
    iVar1 = Acb_ObjFanoutNum(p,Pivot);
    if (iVar1 < 1) {
      __assert_fail("Acb_ObjFanoutNum(p, Pivot) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                    ,0x296,"void Acb_NtkResetNode(Acb_Ntk_t *, int, word, Vec_Int_t *)");
    }
    Acb_ObjAddFanins(p,Pivot,vSupp);
    Acb_ObjAddFaninFanout(p,Pivot);
  }
  for (pFanins._4_4_ = 0; iVar1 = Vec_IntSize(p_00), pFanins._4_4_ < iVar1;
      pFanins._4_4_ = pFanins._4_4_ + 1) {
    iVar1 = Vec_IntEntry(p_00,pFanins._4_4_);
    iVar2 = Acb_ObjIsCio(p,iVar1);
    if ((iVar2 == 0) && (iVar2 = Acb_ObjFanoutNum(p,iVar1), iVar2 == 0)) {
      Acb_NtkResetNode(p,iVar1,0,(Vec_Int_t *)0x0);
    }
  }
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Acb_NtkResetNode( Acb_Ntk_t * p, int Pivot, word uTruth, Vec_Int_t * vSupp )
{
    // remember old fanins
    int k, iFanin, * pFanins; 
    Vec_Int_t * vFanins = Vec_IntAlloc( 6 );
    assert( !Acb_ObjIsCio(p, Pivot) );
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
        Vec_IntPush( vFanins, iFanin );
    // update function
    Vec_WrdSetEntry( &p->vObjTruth, Pivot, uTruth );
    Vec_IntErase( Vec_WecEntry(&p->vCnfs, Pivot) );
    // remove old fanins
    Acb_ObjRemoveFaninFanout( p, Pivot );
    Acb_ObjRemoveFanins( p, Pivot );
    // add new fanins
    if ( vSupp != NULL )
    {
        assert( Acb_ObjFanoutNum(p, Pivot) > 0 );
        Acb_ObjAddFanins( p, Pivot, vSupp );
        Acb_ObjAddFaninFanout( p, Pivot );
    }
    else if ( Acb_ObjFanoutNum(p, Pivot) == 0 )
        Acb_ObjCleanType( p, Pivot );
    // delete dangling fanins
    Vec_IntForEachEntry( vFanins, iFanin, k )
        if ( !Acb_ObjIsCio(p, iFanin) && Acb_ObjFanoutNum(p, iFanin) == 0 )
            Acb_NtkResetNode( p, iFanin, 0, NULL );
    Vec_IntFree( vFanins );
}